

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::internalAppendTag(TestCaseInfo *this,StringRef tagStr)

{
  long lVar1;
  size_type in_RCX;
  StringRef rhs;
  StringRef local_50;
  long local_40;
  size_type backingEnd;
  char *local_30;
  long local_28;
  size_type backingStart;
  TestCaseInfo *this_local;
  StringRef tagStr_local;
  
  tagStr_local.m_start = (char *)tagStr.m_size;
  this_local = (TestCaseInfo *)tagStr.m_start;
  backingStart = (size_type)this;
  std::__cxx11::string::operator+=((string *)&this->backingTags,'[');
  local_28 = std::__cxx11::string::size();
  backingEnd = (size_type)this_local;
  local_30 = tagStr_local.m_start;
  rhs.m_size = in_RCX;
  rhs.m_start = tagStr_local.m_start;
  Catch::operator+=((Catch *)&this->backingTags,&this_local->name,rhs);
  local_40 = std::__cxx11::string::size();
  std::__cxx11::string::operator+=((string *)&this->backingTags,']');
  lVar1 = std::__cxx11::string::c_str();
  StringRef::StringRef(&local_50,(char *)(lVar1 + local_28),local_40 - local_28);
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::emplace_back<Catch::StringRef>
            (&this->tags,&local_50);
  return;
}

Assistant:

void TestCaseInfo::internalAppendTag(StringRef tagStr) {
        backingTags += '[';
        const auto backingStart = backingTags.size();
        backingTags += tagStr;
        const auto backingEnd = backingTags.size();
        backingTags += ']';
        tags.emplace_back(StringRef(backingTags.c_str() + backingStart, backingEnd - backingStart));
    }